

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::PrimitiveInstanceSymbol::serializeTo
          (PrimitiveInstanceSymbol *this,ASTSerializer *serializer)

{
  TimingControl *__n;
  long lVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar2;
  pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_> pVar3;
  string_view sVar4;
  string_view name;
  
  sVar4._M_str = "primitiveType";
  sVar4._M_len = 0xd;
  ASTSerializer::writeLink(serializer,sVar4,&this->primitiveType->super_Symbol);
  name._M_str = "ports";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  sVar2 = getPortConnections(this);
  for (lVar1 = 0; sVar2._M_extent._M_extent_value._M_extent_value << 3 != lVar1; lVar1 = lVar1 + 8)
  {
    ASTSerializer::serialize(serializer,*(Expression **)((long)sVar2._M_ptr + lVar1));
  }
  ASTSerializer::endArray(serializer);
  __n = getDelay(this);
  if (__n != (TimingControl *)0x0) {
    ASTSerializer::write(serializer,5,"delay",(size_t)__n);
  }
  pVar3 = getDriveStrength(this);
  if (((ulong)pVar3.first.super__Optional_base<slang::ast::DriveStrength,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DriveStrength>.
              super__Optional_base<slang::ast::DriveStrength,_true,_true> >> 0x20 & 1) != 0) {
    sVar4 = ast::toString(pVar3.first.super__Optional_base<slang::ast::DriveStrength,_true,_true>.
                          _M_payload.super__Optional_payload_base<slang::ast::DriveStrength>.
                          _M_payload);
    ASTSerializer::write(serializer,0xe,"driveStrength0",sVar4._M_len);
  }
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
    return;
  }
  sVar4 = ast::toString(pVar3.second.super__Optional_base<slang::ast::DriveStrength,_true,_true>.
                        _M_payload.super__Optional_payload_base<slang::ast::DriveStrength>.
                        _M_payload);
  ASTSerializer::write(serializer,0xe,"driveStrength1",sVar4._M_len);
  return;
}

Assistant:

void PrimitiveInstanceSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.writeLink("primitiveType", primitiveType);

    serializer.startArray("ports");
    for (auto expr : getPortConnections())
        serializer.serialize(*expr);
    serializer.endArray();

    if (auto delayCtrl = getDelay())
        serializer.write("delay", *delayCtrl);

    auto [ds0, ds1] = getDriveStrength();
    if (ds0)
        serializer.write("driveStrength0", toString(*ds0));
    if (ds1)
        serializer.write("driveStrength1", toString(*ds1));
}